

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_MultipleSubcomMatchingWithCaseFirst_Test::TestBody
          (TApp_MultipleSubcomMatchingWithCaseFirst_Test *this)

{
  bool bVar1;
  App *this_00;
  AssertHelper local_e8;
  Message local_e0 [2];
  OptionAlreadyAdded *anon_var_0;
  string local_c8;
  allocator local_a1;
  string local_a0;
  byte local_79;
  char *pcStack_78;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_MultipleSubcomMatchingWithCaseFirst_Test *local_10;
  TApp_MultipleSubcomMatchingWithCaseFirst_Test *this_local;
  
  this_00 = &(this->super_TApp).app;
  local_10 = this;
  CLI::App::ignore_case(this_00,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"first",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)((long)&gtest_msg.value + 7));
  CLI::App::add_subcommand(this_00,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff88,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff88);
  if (bVar1) {
    local_79 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"fIrst",&local_a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"",(allocator *)((long)&anon_var_0 + 7));
      CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    if ((local_79 & 1) != 0) {
      return;
    }
    pcStack_78 = 
    "Expected: app.add_subcommand(\"fIrst\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x59,pcStack_78);
  testing::internal::AssertHelper::operator=(&local_e8,local_e0);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  testing::Message::~Message(local_e0);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCaseFirst) {
    app.ignore_case();
    app.add_subcommand("first");
    EXPECT_THROW(app.add_subcommand("fIrst"), CLI::OptionAlreadyAdded);
}